

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall despot::VNode::PrintPolicyTree(VNode *this,int depth,ostream *os)

{
  double dVar1;
  int iVar2;
  pointer ppQVar3;
  QNode *pQVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  VNode *this_00;
  long lVar7;
  long lVar8;
  ulong uVar9;
  _Self __tmp;
  QNode *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  allocator<char> local_91;
  ostream *local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  string local_70;
  string local_50;
  
  if ((depth == -1) || (this->depth_ <= depth)) {
    ppQVar3 = (this->children_).
              super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar7 = (long)(this->children_).
                  super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppQVar3;
    local_90 = os;
    if (lVar7 == 0) {
      iVar2 = (this->default_move_).action;
      poVar5 = std::ostream::_M_insert<void_const*>(os);
      poVar5 = std::operator<<(poVar5,"-a=");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      std::endl<char,std::char_traits<char>>(poVar5);
      return;
    }
    this_01 = (QNode *)0x0;
    for (lVar8 = 0; lVar7 >> 3 != lVar8; lVar8 = lVar8 + 1) {
      pQVar4 = ppQVar3[lVar8];
      if ((this_01 == (QNode *)0x0) ||
         (dVar1 = pQVar4->lower_bound_,
         this_01->lower_bound_ <= dVar1 && dVar1 != this_01->lower_bound_)) {
        this_01 = pQVar4;
      }
    }
    poVar5 = std::ostream::_M_insert<void_const*>(os);
    poVar5 = std::operator<<(poVar5,"-a=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this_01->edge_);
    std::endl<char,std::char_traits<char>>(poVar5);
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (p_Var6 = (this_01->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this_01->children_)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
                 (value_type_conflict2 *)(p_Var6 + 1));
    }
    for (uVar9 = 0;
        uVar9 < (ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar9 = uVar9 + 1) {
      if ((depth == -1) || (this->depth_ < depth)) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"|   ",&local_91);
        repeat(&local_50,&local_70,this->depth_);
        poVar5 = std::operator<<(local_90,(string *)&local_50);
        poVar5 = std::operator<<(poVar5,"| o=");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,": ");
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = QNode::Child(this_01,local_88._M_impl.super__Vector_impl_data._M_start[uVar9]);
        PrintPolicyTree(this_00,depth,local_90);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_88);
  }
  return;
}

Assistant:

void VNode::PrintPolicyTree(int depth, ostream& os) {
	if (depth != -1 && this->depth() > depth)
		return;

	vector<QNode*>& qnodes = children();
	if (qnodes.size() == 0) {
		ACT_TYPE astar = this->default_move().action;
		os << this << "-a=" << astar << endl;
	} else {
		QNode* qstar = NULL;
		for (int a = 0; a < qnodes.size(); a++) {
			QNode* qnode = qnodes[a];
			if (qstar == NULL || qnode->lower_bound() > qstar->lower_bound()) {
				qstar = qnode;
			}
		}

		os << this << "-a=" << qstar->edge() << endl;

		vector<OBS_TYPE> labels;
		map<OBS_TYPE, VNode*>& vnodes = qstar->children();
		for (map<OBS_TYPE, VNode*>::iterator it = vnodes.begin();
			it != vnodes.end(); it++) {
			labels.push_back(it->first);
		}

		for (int i = 0; i < labels.size(); i++) {
			if (depth == -1 || this->depth() + 1 <= depth) {
				os << repeat("|   ", this->depth()) << "| o=" << labels[i]
					<< ": ";
				qstar->Child(labels[i])->PrintPolicyTree(depth, os);
			}
		}
	}
}